

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<TxInUndoFormatter>::
Unser<HashVerifier<AutoFile>,std::vector<Coin,std::allocator<Coin>>>
          (VectorFormatter<TxInUndoFormatter> *this,HashVerifier<AutoFile> *s,
          vector<Coin,_std::allocator<Coin>_> *v)

{
  unsigned_long *puVar1;
  TxInUndoFormatter *this_00;
  unsigned_long *puVar2;
  vector<Coin,_std::allocator<Coin>_> *in_RDX;
  Coin *in_RSI;
  HashVerifier<AutoFile> *in_RDI;
  long in_FS_OFFSET;
  size_t allocated;
  size_t size;
  TxInUndoFormatter formatter;
  bool in_stack_00000047;
  HashVerifier<AutoFile> *in_stack_00000048;
  Coin *in_stack_ffffffffffffffb8;
  unsigned_long *puVar3;
  size_type in_stack_fffffffffffffff0;
  vector<Coin,_std::allocator<Coin>_> *this_01;
  
  this_01 = *(vector<Coin,_std::allocator<Coin>_> **)(in_FS_OFFSET + 0x28);
  std::vector<Coin,_std::allocator<Coin>_>::clear
            ((vector<Coin,_std::allocator<Coin>_> *)in_stack_ffffffffffffffb8);
  puVar1 = (unsigned_long *)
           ReadCompactSize<HashVerifier<AutoFile>>(in_stack_00000048,in_stack_00000047);
  puVar3 = (unsigned_long *)0x0;
  while (puVar3 < puVar1) {
    this_00 = (TxInUndoFormatter *)((long)puVar3 + 0x196e6);
    puVar3 = std::min<unsigned_long>(puVar3,(unsigned_long *)in_stack_ffffffffffffffb8);
    puVar3 = (unsigned_long *)*puVar3;
    std::vector<Coin,_std::allocator<Coin>_>::reserve(this_01,in_stack_fffffffffffffff0);
    while (puVar2 = (unsigned_long *)
                    std::vector<Coin,_std::allocator<Coin>_>::size
                              ((vector<Coin,_std::allocator<Coin>_> *)in_stack_ffffffffffffffb8),
          puVar2 < puVar3) {
      in_stack_ffffffffffffffb8 = in_RSI;
      std::vector<Coin,_std::allocator<Coin>_>::emplace_back<>(in_RDX);
      in_RSI = in_stack_ffffffffffffffb8;
      std::vector<Coin,_std::allocator<Coin>_>::back
                ((vector<Coin,_std::allocator<Coin>_> *)in_stack_ffffffffffffffb8);
      TxInUndoFormatter::Unser<HashVerifier<AutoFile>>(this_00,in_RDI,in_RSI);
    }
  }
  if (*(vector<Coin,_std::allocator<Coin>_> **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }